

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChInertiaCosseratAdvanced::ComputeInertiaDampingMatrix
          (ChInertiaCosseratAdvanced *this,ChMatrixNM<double,_6,_6> *Ri,ChVector<double> *mW)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Matrix<double,_3,_3,_1,_3,_3> *local_1f8;
  undefined8 *puStack_1f0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *local_1e8;
  Scalar local_1d8;
  Scalar local_1d0;
  Scalar local_1c8;
  undefined1 local_1c0 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *local_1b0;
  variable_if_dynamic<long,__1> local_1a8;
  variable_if_dynamic<long,__1> local_1a0;
  Index local_198;
  double *local_190 [2];
  scalar_constant_op<double> local_180;
  LhsNested local_178;
  RhsNested local_170;
  RhsNested local_168;
  ChMatrix33<double> mI;
  Matrix<double,_3,_3,_1,_3,_3> local_108;
  undefined8 local_c0;
  undefined8 local_b8;
  double local_b0;
  double dStack_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined1 local_88 [16];
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_78;
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  undefined8 local_38;
  
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)Ri);
  if ((this->super_ChInertiaCosserat).compute_inertia_damping_matrix != false) {
    if ((this->super_ChInertiaCosserat).compute_Ri_Ki_by_num_diff == true) {
      ChInertiaCosserat::ComputeInertiaDampingMatrix(&this->super_ChInertiaCosserat,Ri,mW);
      return;
    }
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    dVar1 = mW->m_data[2];
    auVar13._0_8_ = -dVar1;
    auVar13._8_8_ = 0x8000000000000000;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = (double)vmovlpd_avx(auVar13);
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    auVar4 = *(undefined1 (*) [16])mW->m_data;
    dVar2 = mW->m_data[1];
    local_c0 = 0;
    dVar18 = -auVar4._0_8_;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
         = (double)vmovlpd_avx(auVar4);
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    dVar7 = this->cm_y;
    dStack_a8 = this->cm_z;
    dVar3 = this->cm_z;
    auVar14._0_8_ = -dVar3;
    auVar14._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = -dVar7;
    auVar22._8_8_ = -dStack_a8;
    local_b8 = vmovlpd_avx(auVar14);
    local_88 = ZEXT816(0);
    local_a0 = vmovhpd_avx(local_88,0x8000000000000000);
    local_90 = vmovlpd_avx(auVar22);
    local_78.m_xpr = &mI.super_Matrix<double,_3,_3,_1,_3,_3>;
    mI.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         this->Jyy + this->Jzz;
    local_78.m_row = 0;
    local_78.m_col = 1;
    local_78.m_currentBlockRows = 1;
    local_190[0] = (double *)0x0;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
         = dVar2;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
         = dVar1;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = dVar18;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = -auVar4._8_8_;
    local_b0 = dVar7;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (&local_78,(Scalar *)local_190);
    local_1c0._0_8_ = (LhsNested)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar11,(Scalar *)local_1c0);
    local_1f8 = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar11,(Scalar *)&local_1f8);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar11,&this->Jyy);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = this->Jyz;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar15,auVar6);
    local_1c8 = (Scalar)vmovlpd_avx(auVar12);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar11,&local_1c8);
    local_1d0 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar11,&local_1d0);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = this->Jyz;
    auVar19._8_8_ = 0x8000000000000000;
    auVar19._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar16,auVar19);
    local_1d8 = (Scalar)vmovlpd_avx(auVar12);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                        (pCVar11,&local_1d8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_(pCVar11,&this->Jzz);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::finished(&local_78);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar1;
    auVar19 = ZEXT816(0) << 0x40;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar3;
    local_1f8 = &local_108;
    local_78.m_xpr = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar7 * dVar1;
    auVar6 = vfmsub231sd_fma(auVar17,auVar19,auVar12);
    puStack_1f0 = &local_c0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar7 * 0.0;
    auVar12 = vfmadd231sd_fma(auVar23,auVar19,auVar9);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar2;
    auVar5 = vfmadd231sd_fma(auVar6,auVar8,auVar5);
    auVar6 = vfnmadd231sd_fma(auVar12,auVar4,auVar8);
    auVar10._8_8_ = -auVar4._8_8_;
    auVar10._0_8_ = dVar18;
    auVar12 = vpermilps_avx(auVar10,0x4e);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar7 * auVar4._0_8_;
    auVar4 = vfmadd213sd_fma(auVar12,auVar19,auVar24);
    auVar4 = vfmadd231sd_fma(auVar4,auVar8,auVar19);
    local_78.m_currentBlockRows = auVar4._0_8_;
    auVar20._0_8_ = local_78.m_currentBlockRows ^ 0x8000000000000000;
    auVar20._8_8_ = auVar4._8_8_ ^ 0x8000000000000000;
    local_78.m_row = vmovlpd_avx(auVar20);
    auVar4 = vunpcklpd_avx(auVar5,auVar6);
    local_78.m_col = auVar6._0_8_;
    local_58 = 0;
    local_50._8_8_ = auVar4._8_8_ ^ 0x8000000000000000;
    local_50._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
    local_40 = auVar5._0_8_;
    local_38 = 0;
    local_1e8 = &local_78;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                      *)local_190,&this->mu,(StorageBaseType *)&local_1f8);
    local_1c0._0_8_ =
         (Ri->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array +
         3;
    local_1a8.m_value = 0;
    local_1a0.m_value = 3;
    local_198 = 6;
    local_1b0 = (CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> *)local_1c0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
                *)local_190);
    ChMatrix33<double>::operator*(&mI,mW);
    local_78.m_xpr = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    local_1c0._0_8_ = &local_108;
    local_1c0._8_8_ = &mI;
    local_190[0] = (Ri->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.
                   m_data.array + 0x15;
    auVar21._0_8_ = (ulong)local_1e8 ^ 0x8000000000000000;
    auVar21._8_4_ = 0;
    auVar21._12_4_ = 0x80000000;
    local_78.m_row = vmovlps_avx(auVar21);
    local_78.m_currentBlockRows = (Index)local_1e8;
    auVar4._8_8_ = puStack_1f0;
    auVar4._0_8_ = local_1f8;
    local_58 = 0;
    local_78.m_col = (Index)puStack_1f0;
    local_50._0_8_ = (ulong)local_1f8 ^ 0x8000000000000000;
    local_50._8_4_ = (int)puStack_1f0;
    local_50._12_4_ = (uint)((ulong)puStack_1f0 >> 0x20) ^ 0x80000000;
    local_40 = vmovlps_avx(auVar4);
    local_38 = 0;
    local_178 = (LhsNested)0x3;
    local_170.m_matrix = (non_const_type)0x3;
    local_168.m_matrix = (non_const_type)0x6;
    local_1b0 = &local_78;
    local_180.m_other = (double)Ri;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,1,6,6>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Matrix<double,3,3,1,3,3>const>>
              ((Block<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_3,_3,_false> *)local_190,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                *)local_1c0);
  }
  return;
}

Assistant:

void ChInertiaCosseratAdvanced::ComputeInertiaDampingMatrix(
    ChMatrixNM<double, 6, 6>& Ri,  ///< 6x6 sectional inertial-damping (gyroscopic damping) matrix values here
    const ChVector<>& mW           ///< current angular velocity of section, in material frame
) {
    Ri.setZero();
    if (compute_inertia_damping_matrix == false)
        return;
    if (this->compute_Ri_Ki_by_num_diff)
        return ChInertiaCosserat::ComputeInertiaDampingMatrix(Ri, mW);

    ChStarMatrix33<> wtilde(mW);  // [w~]
    ChVector<> mC(0, this->cm_y, this->cm_z);
    ChStarMatrix33<> ctilde(mC);  // [c~]
    ChMatrix33<> mI;
    mI << this->Jyy + this->Jzz, 0, 0, 0, this->Jyy, -this->Jyz, 0, -this->Jyz, this->Jzz;
    //  Ri = [0,  m*[w~][c~]' + m*[([w~]*c)~]'  ; 0 , [w~][I] - [([I]*w)~]  ]
    Ri.block<3, 3>(0, 3) = this->mu * (wtilde * ctilde.transpose() + (ChStarMatrix33<>(wtilde * mC)).transpose());
    Ri.block<3, 3>(3, 3) = wtilde * mI - ChStarMatrix33<>(mI * mW);
}